

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbdstrmatrix.cpp
# Opt level: O1

void __thiscall
TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::
BlockSizes(TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this,TPZVec<int> *blocksizes)

{
  TPZCompMesh *pTVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  TPZConnect *pTVar5;
  int64_t iVar6;
  long minindex;
  ulong uVar7;
  long lVar8;
  TPZAdmChunkVector<TPZConnect,_10> *this_00;
  
  lVar4 = (**(code **)(*(long *)(this->super_TPZStructMatrixT<std::complex<double>_>).
                                super_TPZStructMatrix.fMesh + 0x98))();
  if (lVar4 != 0) {
    TPZSubCompMesh::PermuteExternalConnects
              ((TPZSubCompMesh *)
               (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh);
  }
  pTVar1 = (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh;
  lVar4 = (pTVar1->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  this_00 = &pTVar1->fConnectVec;
  uVar7 = 0;
  if (0 < lVar4) {
    lVar8 = 0;
    do {
      pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&this_00->super_TPZChunkVector<TPZConnect,_10>,lVar8);
      if ((pTVar5->fDependList == (TPZDepend *)0x0) &&
         ((pTVar5->field_2).fCompose.fIsCondensed == false)) {
        uVar7 = (ulong)((int)uVar7 + (uint)(-1 < pTVar5->fSequenceNumber));
      }
      lVar8 = lVar8 + 1;
    } while (lVar4 != lVar8);
    uVar7 = (ulong)(int)uVar7;
  }
  (*blocksizes->_vptr_TPZVec[3])(blocksizes,uVar7);
  if (0 < lVar4) {
    lVar8 = 0;
    do {
      pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&this_00->super_TPZChunkVector<TPZConnect,_10>,lVar8);
      if (((pTVar5->fDependList == (TPZDepend *)0x0) &&
          ((pTVar5->field_2).fCompose.fIsCondensed == false)) &&
         (lVar2 = pTVar5->fSequenceNumber, -1 < lVar2)) {
        iVar3 = TPZConnect::NDof(pTVar5,(this->super_TPZStructMatrixT<std::complex<double>_>).
                                        super_TPZStructMatrix.fMesh);
        minindex = (long)(((this->super_TPZStructMatrixT<std::complex<double>_>).
                           super_TPZStructMatrix.fMesh)->fBlock).fBlock.
                         super_TPZVec<TPZBlock::TNode>.fStore[(int)lVar2].pos;
        iVar6 = TPZEquationFilter::NumActive
                          (&(this->super_TPZStructMatrixT<std::complex<double>_>).
                            super_TPZStructMatrix.fEquationFilter,minindex,iVar3 + minindex);
        if ((iVar6 != 0) && (iVar6 != iVar3)) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzbdstrmatrix.cpp"
                     ,0x54);
        }
        if (iVar6 == 0) {
          iVar3 = 0;
        }
        blocksizes->fStore[lVar2] = iVar3;
      }
      lVar8 = lVar8 + 1;
    } while (lVar4 != lVar8);
  }
  return;
}

Assistant:

void TPZBlockDiagonalStructMatrix<TVar,TPar>::BlockSizes(TPZVec < int > & blocksizes){
    
    if(this->fMesh->FatherMesh() != 0) {
        TPZSubCompMesh *mesh = (TPZSubCompMesh *) this->fMesh;
        mesh->PermuteExternalConnects();
    }
    int nblocks = 0;
    TPZAdmChunkVector<TPZConnect> &connectvec = this->fMesh->ConnectVec();
    int64_t nc = connectvec.NElements();
    int64_t c;
    for(c=0; c<nc; c++) {
        TPZConnect &con = connectvec[c];
        if(con.HasDependency() || con.IsCondensed() || con.SequenceNumber() < 0) continue;
        nblocks++;
    }
    blocksizes.Resize(nblocks);
    int64_t bl,blsize;
    for(c=0; c<nc; c++) {
        TPZConnect &con = connectvec[c];
        if(con.HasDependency() || con.IsCondensed() || con.SequenceNumber() < 0) continue;
        bl = con.SequenceNumber();
        blsize = con.NDof(*this->fMesh);
        int64_t blpos = this->fMesh->Block().Position(bl);
        int64_t numactiv = this->fEquationFilter.NumActive(blpos, blpos+blsize);
        if (numactiv && numactiv != blsize) {
            DebugStop();
        }
        if(!numactiv)
        {
            blocksizes[bl] = 0;
        }
        else
        {
            blocksizes[bl] = blsize;
        }
    }
}